

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha.cc
# Opt level: O0

bool __thiscall sshash::sha::digest(sha *this,string *out,char *str,uint n)

{
  EVP_MD *type;
  EVP_MD_CTX *ctx;
  ulong uVar1;
  uint local_9c;
  ulong uStack_98;
  uint i;
  uint64_t d;
  EVP_MD_CTX *mdctx;
  EVP_MD *md;
  byte local_78 [4];
  int md_len;
  uchar md_out [64];
  uint n_local;
  char *str_local;
  string *out_local;
  sha *this_local;
  
  if (str == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    type = (EVP_MD *)EVP_shake128();
    if (type == (EVP_MD *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
      EVP_DigestInit_ex(ctx,type,(ENGINE *)0x0);
      EVP_DigestUpdate(ctx,str,(ulong)n);
      EVP_DigestFinalXOF(ctx,local_78,8);
      EVP_MD_CTX_free(ctx);
      uStack_98 = 0;
      for (local_9c = 0; local_9c < 8; local_9c = local_9c + 1) {
        uStack_98 = uStack_98 << 8 | (ulong)local_78[local_9c];
      }
      std::__cxx11::string::clear();
      std::__cxx11::string::operator+=((string *)out,this->_map[uStack_98 % 0x34]);
      uStack_98 = uStack_98 / 0x34;
      while( true ) {
        uVar1 = std::__cxx11::string::size();
        if (this->_abbrev <= uVar1) break;
        std::__cxx11::string::operator+=((string *)out,this->_map[uStack_98 % 0x3e]);
        uStack_98 = uStack_98 / 0x3e;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool sha::digest(std::string &out, const char *str, unsigned int n)
{
	if (!str)
		return false;

	unsigned char md_out[EVP_MAX_MD_SIZE];
	const int md_len = 8;

#ifdef SN_shake128
	// Use SHAKE128 with 8 byte digest length
	const EVP_MD *md = EVP_shake128();
	if (!md)
		return false;

	EVP_MD_CTX *mdctx = EVP_MD_CTX_new();
	EVP_DigestInit_ex(mdctx, md, NULL);
	EVP_DigestUpdate(mdctx, str, n);

	EVP_DigestFinalXOF(mdctx, md_out, md_len);

	EVP_MD_CTX_free(mdctx);
#else
	SHA512((const unsigned char *)str, n, md_out);
#endif

	// Convert digest into uint64
	uint64_t d = 0;
	for (unsigned int i = 0; i < md_len; i++)
		d = (d << 8) | md_out[i];

	// Convert into alpha-numeric string
	out.clear();

	// First char is generated using only the basemap to ensure the hash str
	// never starts with a digit.
	out += _map[d % BASE_MAPSIZE];
	d /= BASE_MAPSIZE;

	for (; out.size() < _abbrev; d /= FULL_MAPSIZE)
		out += _map[d % FULL_MAPSIZE];

	return true;
}